

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagateNoContraction.cpp
# Opt level: O3

void glslang::PropagateNoContraction(TIntermediate *intermediate)

{
  TIntermNode *pTVar1;
  key_type pTVar2;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_false,_true>
  _Var3;
  undefined8 uVar4;
  bool bVar5;
  byte bVar6;
  long *plVar7;
  const_iterator cVar8;
  long *plVar9;
  long lVar10;
  long *plVar11;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
  _Var12;
  _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_false,_true>
  __tmp;
  _Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_false,_true>_>
  pVar13;
  TIntermBranch *precise_return_node;
  ObjectAccessChain assignee_object;
  ObjectAccessChain precise_object_accesschain;
  ObjectAccessChain symbol_id;
  tuple<std::unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>_>,_std::unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::unordered_set<glslang::TIntermBranch_*,_std::hash<glslang::TIntermBranch_*>,_std::equal_to<glslang::TIntermBranch_*>,_std::allocator<glslang::TIntermBranch_*>_>_>
  mappings_and_precise_objects;
  undefined1 local_2d0 [24];
  TString *pTStack_2b8;
  ulong local_2b0;
  size_t local_2a8;
  undefined1 auStack_2a0 [8];
  key_type local_298;
  size_type local_290;
  undefined1 local_288 [24];
  _Hashtable<glslang::TIntermBranch_*,_glslang::TIntermBranch_*,_std::allocator<glslang::TIntermBranch_*>,_std::__detail::_Identity,_std::equal_to<glslang::TIntermBranch_*>,_std::hash<glslang::TIntermBranch_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_270;
  anon_union_8_2_8ac53c11_for_TType_13 local_238;
  long local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined1 local_218 [9];
  undefined7 uStack_20f;
  undefined4 local_208;
  undefined4 uStack_204;
  anon_union_8_2_8ac53c11_for_TType_13 aStack_200;
  TString *local_1f8;
  TString *pTStack_1f0;
  undefined1 auStack_1e8 [16];
  anon_union_8_2_8ac53c11_for_TType_13 *local_1d8;
  ObjectAccessChain local_1d0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  local_1b0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  *local_178;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_170;
  undefined1 *local_138;
  char *local_130;
  undefined1 local_128;
  undefined7 uStack_127;
  _Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_118;
  _Hashtable<glslang::TIntermBranch_*,_glslang::TIntermBranch_*,_std::allocator<glslang::TIntermBranch_*>,_std::__detail::_Identity,_std::equal_to<glslang::TIntermBranch_*>,_std::hash<glslang::TIntermBranch_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_110;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_d8;
  _Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  local_68;
  
  local_1b0._M_buckets = &local_1b0._M_single_bucket;
  local_1b0._M_bucket_count._0_1_ = 1;
  local_1b0._M_bucket_count._1_7_ = 0;
  local_1b0._M_before_begin._M_nxt._0_4_ = 0;
  local_1b0._M_before_begin._M_nxt._4_4_ = 0;
  local_1b0._M_element_count = 0;
  local_1b0._M_rehash_policy._M_max_load_factor = 1.0;
  local_1b0._M_rehash_policy._4_4_ = 0;
  local_1b0._M_rehash_policy._M_next_resize = 0;
  local_1b0._M_single_bucket = (__node_base_ptr)0x0;
  local_218._0_8_ = auStack_1e8;
  local_218[8] = true;
  uStack_20f._0_1_ = false;
  uStack_20f._1_6_ = 0;
  local_208 = 0;
  uStack_204 = 0;
  aStack_200.structure = (TTypeList *)0x0;
  local_1f8 = (TString *)0x3f800000;
  pTStack_1f0 = (TString *)0x0;
  auStack_1e8._0_8_ = (__node_base_ptr)0x0;
  local_2d0._0_8_ = auStack_2a0;
  local_2d0._8_8_ = 1;
  local_2d0._16_8_ = (_Hash_node_base *)0x0;
  pTStack_2b8 = (TString *)0x0;
  local_2b0 = 0x3f800000;
  local_2a8 = 0;
  auStack_2a0 = (undefined1  [8])0x0;
  local_270._M_buckets = &local_270._M_single_bucket;
  local_270._M_bucket_count = 1;
  local_270._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_270._M_element_count = 0;
  local_270._M_rehash_policy._M_max_load_factor = 1.0;
  local_270._M_rehash_policy._4_4_ = 0;
  local_270._M_rehash_policy._M_next_resize = 0;
  local_270._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Tuple_impl<1ul,std::unordered_map<glslang::TIntermTyped*,std::__cxx11::string,std::hash<glslang::TIntermTyped*>,std::equal_to<glslang::TIntermTyped*>,std::allocator<std::pair<glslang::TIntermTyped*const,std::__cxx11::string>>>,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::unordered_set<glslang::TIntermBranch*,std::hash<glslang::TIntermBranch*>,std::equal_to<glslang::TIntermBranch*>,std::allocator<glslang::TIntermBranch*>>>
  ::
  _Tuple_impl<std::unordered_map<glslang::TIntermTyped*,std::__cxx11::string,std::hash<glslang::TIntermTyped*>,std::equal_to<glslang::TIntermTyped*>,std::allocator<std::pair<glslang::TIntermTyped*const,std::__cxx11::string>>>,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::unordered_set<glslang::TIntermBranch*,std::hash<glslang::TIntermBranch*>,std::equal_to<glslang::TIntermBranch*>,std::allocator<glslang::TIntermBranch*>>,void>
            ((_Tuple_impl<1ul,std::unordered_map<glslang::TIntermTyped*,std::__cxx11::string,std::hash<glslang::TIntermTyped*>,std::equal_to<glslang::TIntermTyped*>,std::allocator<std::pair<glslang::TIntermTyped*const,std::__cxx11::string>>>,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::unordered_set<glslang::TIntermBranch*,std::hash<glslang::TIntermBranch*>,std::equal_to<glslang::TIntermBranch*>,std::allocator<glslang::TIntermBranch*>>>
              *)&local_110,
             (unordered_map<glslang::TIntermTyped_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<glslang::TIntermTyped_*>,_std::equal_to<glslang::TIntermTyped_*>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_218,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_2d0,
             (unordered_set<glslang::TIntermBranch_*,_std::hash<glslang::TIntermBranch_*>,_std::equal_to<glslang::TIntermBranch_*>,_std::allocator<glslang::TIntermBranch_*>_>
              *)&local_270);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::_Hashtable(&local_68,&local_1b0,&local_1b0);
  std::
  _Hashtable<glslang::TIntermBranch_*,_glslang::TIntermBranch_*,_std::allocator<glslang::TIntermBranch_*>,_std::__detail::_Identity,_std::equal_to<glslang::TIntermBranch_*>,_std::hash<glslang::TIntermBranch_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_270);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_2d0);
  std::
  _Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_218);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::~_Hashtable(&local_1b0);
  pTVar1 = intermediate->treeRoot;
  if (pTVar1 != (TIntermNode *)0x0) {
    local_1b0._M_bucket_count._0_1_ = 1;
    local_1b0._M_bucket_count._1_7_ = 0;
    local_1b0._M_before_begin._M_nxt._0_4_ = 0;
    local_1b0._M_element_count = (size_type)GetThreadPoolAllocator();
    local_1b0._M_rehash_policy._M_max_load_factor = 0.0;
    local_1b0._M_rehash_policy._4_4_ = 0;
    local_1b0._M_rehash_policy._M_next_resize = 0;
    local_1b0._M_single_bucket = (__node_base_ptr)0x0;
    local_1b0._M_buckets = (__buckets_ptr)&PTR__TSymbolDefinitionCollectingTraverser_0092d440;
    local_178 = &local_68;
    local_170._M_bucket_count = (size_type)&local_110;
    local_170._M_element_count = 0;
    local_170._M_rehash_policy._0_8_ = local_170._M_rehash_policy._0_8_ & 0xffffffffffffff00;
    local_170._M_single_bucket = (__node_base_ptr)&local_a0;
    local_138 = (undefined1 *)0x0;
    local_170._M_buckets = (__buckets_ptr)&local_d8;
    local_170._M_before_begin._M_nxt = (_Hash_node_base *)&local_170._M_rehash_policy;
    (*pTVar1->_vptr_TIntermNode[2])(pTVar1);
    local_1b0._M_buckets = (__buckets_ptr)&PTR__TSymbolDefinitionCollectingTraverser_0092d440;
    if ((_Prime_rehash_policy *)local_170._M_before_begin._M_nxt != &local_170._M_rehash_policy) {
      operator_delete(local_170._M_before_begin._M_nxt,local_170._M_rehash_policy._0_8_ + 1);
    }
  }
  local_218[8] = true;
  uStack_20f._0_1_ = false;
  uStack_20f._1_6_ = 0;
  local_208 = 0;
  aStack_200.structure = (TTypeList *)GetThreadPoolAllocator();
  local_1f8 = (TString *)0x0;
  pTStack_1f0 = (TString *)0x0;
  auStack_1e8._0_8_ = (__node_base_ptr)0x0;
  local_218._0_8_ = &PTR__TIntermTraverser_0092d4a8;
  local_1d8 = (anon_union_8_2_8ac53c11_for_TType_13 *)0x0;
  local_1b0._M_bucket_count._0_1_ = 1;
  local_1b0._M_bucket_count._1_7_ = 0;
  local_1b0._M_before_begin._M_nxt._0_4_ = 0;
  auStack_1e8._8_8_ = &local_a0;
  local_1b0._M_element_count = (size_type)GetThreadPoolAllocator();
  local_1b0._M_rehash_policy._M_max_load_factor = 0.0;
  local_1b0._M_rehash_policy._4_4_ = 0;
  local_1b0._M_rehash_policy._M_next_resize = 0;
  local_1b0._M_single_bucket = (__node_base_ptr)0x0;
  local_1b0._M_buckets = (__buckets_ptr)&PTR__TNoContractionPropagator_0092d510;
  local_170._M_bucket_count = 1;
  local_170._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_170._M_element_count = 0;
  local_170._M_rehash_policy._M_max_load_factor = 1.0;
  local_170._M_rehash_policy._4_4_ = 0;
  local_170._M_rehash_policy._M_next_resize = 0;
  local_170._M_single_bucket = (__node_base_ptr)0x0;
  local_138 = &local_128;
  local_130 = (char *)0x0;
  local_128 = 0;
  local_178 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
               *)&local_d8;
  local_170._M_buckets = &local_170._M_single_bucket;
  local_118 = &local_a0;
  if (local_110._M_element_count != 0) {
    do {
      pTVar2 = (key_type)local_110._M_before_begin._M_nxt[1]._M_nxt;
      local_2d0._0_8_ = pTVar2;
      std::__cxx11::string::_M_replace((ulong)&local_138,0,local_130,0x6cf608);
      if ((*(int *)&(pTVar2->type)._vptr_TType != 0x16a) ||
         (plVar11 = *(long **)&(pTVar2->type).field_0x8, plVar11 == (long *)0x0)) {
        __assert_fail("return_node->getFlowOp() == glslang::EOpReturn && return_node->getExpression()"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                      ,0x28e,
                      "void (anonymous namespace)::TNoContractionPropagator::propagateNoContractionInReturnNode(glslang::TIntermBranch *)"
                     );
      }
      (**(code **)(*plVar11 + 0x10))(plVar11,&local_1b0);
      std::
      _Hashtable<glslang::TIntermBranch_*,_glslang::TIntermBranch_*,_std::allocator<glslang::TIntermBranch_*>,_std::__detail::_Identity,_std::equal_to<glslang::TIntermBranch_*>,_std::hash<glslang::TIntermBranch_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::_M_erase(&local_110);
    } while (local_110._M_element_count != 0);
  }
  if (local_d8._M_element_count != 0) {
    do {
      local_238.structure = (TTypeList *)&local_228;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,local_d8._M_before_begin._M_nxt[1]._M_nxt,
                 (long)&(local_d8._M_before_begin._M_nxt[1]._M_nxt)->_M_nxt +
                 (long)&(local_d8._M_before_begin._M_nxt[2]._M_nxt)->_M_nxt);
      anon_unknown.dwarf_113ab01::getFrontElement(&local_1d0,(ObjectAccessChain *)&local_238);
      pVar13 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
               ::equal_range(&local_68,&local_1d0);
      local_288._16_8_ =
           pVar13.second.
           super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
           ._M_cur;
      if ((__node_type *)
          pVar13.first.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
          ._M_cur != (__node_type *)local_288._16_8_) {
        do {
          _Var12._M_cur =
               (__node_type *)
               pVar13.second.
               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
               ._M_cur;
          plVar11 = *(long **)((long)pVar13.first.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
                                     ._M_cur.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
                              + 0x28);
          bVar5 = anon_unknown.dwarf_113ab01::isAssignOperation(*(TOperator *)(plVar11 + 0x17));
          if (!bVar5) {
            __assert_fail("isAssignOperation(node->getOp())",
                          "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                          ,0x1eb,
                          "std::tuple<bool, ObjectAccessChain> (anonymous namespace)::TNoContractionAssigneeCheckingTraverser::getPrecisenessAndRemainedAccessChain(glslang::TIntermOperator *, const ObjectAccessChain &)"
                         );
          }
          local_270._M_bucket_count = 0;
          local_270._M_before_begin._M_nxt = local_270._M_before_begin._M_nxt & 0xffffffffffffff00;
          local_270._M_buckets = &local_270._M_before_begin._M_nxt;
          local_1d8 = &local_238;
          plVar7 = (long *)(**(code **)(*plVar11 + 0x40))(plVar11);
          uVar4 = auStack_1e8._8_8_;
          if (plVar7 == (long *)0x0) {
            plVar7 = (long *)(**(code **)(*plVar11 + 0x38))(plVar11);
            uVar4 = auStack_1e8._8_8_;
            if (plVar7 == (long *)0x0) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                            ,0x213,
                            "std::tuple<bool, ObjectAccessChain> (anonymous namespace)::TNoContractionAssigneeCheckingTraverser::getPrecisenessAndRemainedAccessChain(glslang::TIntermOperator *, const ObjectAccessChain &)"
                           );
            }
            local_298 = (key_type)(**(code **)(*plVar7 + 0x188))(plVar7);
            cVar8 = std::
                    _Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find((_Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)uVar4,&local_298);
            if (cVar8.
                super__Node_iterator_base<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                ._M_cur == (__node_type *)0x0) {
              __assert_fail("accesschain_mapping_.count(UN->getOperand())",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                            ,0x204,
                            "std::tuple<bool, ObjectAccessChain> (anonymous namespace)::TNoContractionAssigneeCheckingTraverser::getPrecisenessAndRemainedAccessChain(glslang::TIntermOperator *, const ObjectAccessChain &)"
                           );
            }
            plVar9 = (long *)(**(code **)(*plVar7 + 0x188))(plVar7);
            (**(code **)(*plVar9 + 0x10))(plVar9,local_218);
            plVar9 = (long *)(**(code **)(*plVar7 + 0x188))(plVar7);
            plVar9 = (long *)(**(code **)(*plVar9 + 0xf0))(plVar9);
            lVar10 = (**(code **)(*plVar9 + 0x58))(plVar9);
            this = (_Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)auStack_1e8._8_8_;
            if ((*(ulong *)(lVar10 + 8) & 0x1000000000) != 0) goto LAB_00445941;
            local_298 = (key_type)(**(code **)(*plVar7 + 0x188))(plVar7);
LAB_004458ab:
            cVar8 = std::
                    _Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(this,&local_298);
            if (cVar8.
                super__Node_iterator_base<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                ._M_cur == (__node_type *)0x0) {
              std::__throw_out_of_range("_Map_base::at");
            }
            std::__cxx11::string::_M_assign((string *)&local_270);
            lVar10 = std::__cxx11::string::find((char *)&local_270,(ulong)local_238,0);
            if (lVar10 == 0) {
              local_2d0._0_8_ = local_2d0 + 0x10;
              local_2d0._16_8_ = local_2d0._16_8_ & 0xffffffffffffff00;
              local_2d0._8_8_ = 0;
              local_2b0 = CONCAT71(local_2b0._1_7_,1);
              bVar6 = 1;
              _Var12._M_cur = (__node_type *)local_288._16_8_;
            }
            else {
              lVar10 = std::__cxx11::string::find((char *)&local_238,(ulong)local_270._M_buckets,0);
              _Var12._M_cur = (__node_type *)local_288._16_8_;
              if (lVar10 == 0) {
                lVar10 = std::__cxx11::string::find
                                   ((char *)&local_238,(ulong)local_270._M_buckets,0);
                if (lVar10 == 0) {
                  std::__cxx11::string::substr((ulong)&local_298,(ulong)&local_238);
                }
                else {
                  local_298 = (key_type)local_288;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_298,local_238.structure,
                             (long)&(local_238.structure)->
                                    super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             + local_230);
                }
                local_2d0._0_8_ = local_2d0 + 0x10;
                if (local_298 == (key_type)local_288) {
                  pTStack_2b8 = (TString *)local_288._8_8_;
                }
                else {
                  local_2d0._0_8_ = local_298;
                }
                local_2d0._16_8_ = local_288._0_8_;
                local_2d0._8_8_ = local_290;
                local_2b0 = CONCAT71(local_2b0._1_7_,1);
                bVar6 = 1;
              }
              else {
                local_2d0._0_8_ = local_2d0 + 0x10;
                bVar6 = 0;
                local_2d0._16_8_ = local_2d0._16_8_ & 0xffffffffffffff00;
                local_2d0._8_8_ = 0;
                local_2b0 = local_2b0 & 0xffffffffffffff00;
              }
            }
          }
          else {
            local_298 = (key_type)(**(code **)(*plVar7 + 400))(plVar7);
            cVar8 = std::
                    _Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find((_Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                            *)uVar4,&local_298);
            if (cVar8.
                super__Node_iterator_base<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                ._M_cur == (__node_type *)0x0) {
              __assert_fail("accesschain_mapping_.count(BN->getLeft())",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                            ,0x1f1,
                            "std::tuple<bool, ObjectAccessChain> (anonymous namespace)::TNoContractionAssigneeCheckingTraverser::getPrecisenessAndRemainedAccessChain(glslang::TIntermOperator *, const ObjectAccessChain &)"
                           );
            }
            plVar9 = (long *)(**(code **)(*plVar7 + 400))(plVar7);
            (**(code **)(*plVar9 + 0x10))(plVar9,local_218);
            plVar9 = (long *)(**(code **)(*plVar7 + 400))(plVar7);
            plVar9 = (long *)(**(code **)(*plVar9 + 0xf0))(plVar9);
            lVar10 = (**(code **)(*plVar9 + 0x58))(plVar9);
            this = (_Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)auStack_1e8._8_8_;
            if ((*(ulong *)(lVar10 + 8) & 0x1000000000) == 0) {
              local_298 = (key_type)(**(code **)(*plVar7 + 400))(plVar7);
              goto LAB_004458ab;
            }
LAB_00445941:
            local_2d0._0_8_ = local_2d0 + 0x10;
            local_2d0._16_8_ = local_2d0._16_8_ & 0xffffffffffffff00;
            local_2d0._8_8_ = 0;
            local_2b0 = CONCAT71(local_2b0._1_7_,1);
            bVar6 = 1;
          }
          if ((__node_base *)local_270._M_buckets != &local_270._M_before_begin) {
            operator_delete(local_270._M_buckets,
                            (ulong)((long)&(local_270._M_before_begin._M_nxt)->_M_nxt + 1));
            bVar6 = (byte)local_2b0;
          }
          if ((bVar6 & 1) != 0) {
            std::__cxx11::string::_M_assign((string *)&local_138);
            plVar7 = (long *)(**(code **)(*plVar11 + 0x40))(plVar11);
            if (plVar7 == (long *)0x0) {
              plVar7 = (long *)(**(code **)(*plVar11 + 0x38))(plVar11);
              if (plVar7 == (long *)0x0) goto LAB_00445b0e;
              bVar5 = anon_unknown.dwarf_113ab01::isAssignOperation(*(TOperator *)(plVar7 + 0x17));
              if (!bVar5) {
                __assert_fail("isAssignOperation(UN->getOp())",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                              ,0x282,
                              "void (anonymous namespace)::TNoContractionPropagator::propagateNoContractionInOneExpression(glslang::TIntermTyped *, const ObjectAccessChain &)"
                             );
              }
              plVar11 = (long *)(**(code **)(*plVar7 + 0x188))(plVar7);
            }
            else {
              bVar5 = anon_unknown.dwarf_113ab01::isAssignOperation(*(TOperator *)(plVar7 + 0x17));
              if (!bVar5) {
                __assert_fail("isAssignOperation(BN->getOp())",
                              "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/propagateNoContraction.cpp"
                              ,0x27c,
                              "void (anonymous namespace)::TNoContractionPropagator::propagateNoContractionInOneExpression(glslang::TIntermTyped *, const ObjectAccessChain &)"
                             );
              }
              plVar11 = (long *)(**(code **)(*plVar7 + 0x198))(plVar7);
            }
            (**(code **)(*plVar11 + 0x10))(plVar11,&local_1b0);
            bVar5 = anon_unknown.dwarf_113ab01::isArithmeticOperation(*(TOperator *)(plVar7 + 0x17))
            ;
            if (bVar5) {
              plVar11 = (long *)(**(code **)(*plVar7 + 0xf8))(plVar7);
              lVar10 = (**(code **)(*plVar11 + 0x50))(plVar11);
              *(ulong *)(lVar10 + 8) = *(ulong *)(lVar10 + 8) | 0x1000000000;
            }
          }
LAB_00445b0e:
          if ((key_type)local_2d0._0_8_ != (key_type)(local_2d0 + 0x10)) {
            operator_delete((void *)local_2d0._0_8_,
                            (ulong)((long)(_Hash_node_base **)local_2d0._16_8_ + 1));
          }
          _Var3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
          ._M_cur = *(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
                      *)pVar13.first.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
                        ._M_cur.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
          ;
          pVar13.second.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
          ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
                     )(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
                       )_Var12._M_cur;
          pVar13.first.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
          ._M_cur = _Var3.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
                    ._M_cur;
        } while (_Var3.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
                 ._M_cur !=
                 (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_true>
                  )_Var12._M_cur);
      }
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::_M_erase(&local_d8,&local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238.structure != &local_228) {
        operator_delete(local_238.structure,local_228._M_allocated_capacity + 1);
      }
    } while (local_d8._M_element_count != 0);
  }
  local_1b0._M_buckets = (__buckets_ptr)&PTR__TNoContractionPropagator_0092d510;
  if (local_138 != &local_128) {
    operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_170);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glslang::TIntermOperator_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  ::~_Hashtable(&local_68);
  std::
  _Hashtable<glslang::TIntermTyped_*,_std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<glslang::TIntermTyped_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<glslang::TIntermTyped_*>,_std::hash<glslang::TIntermTyped_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_a0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_d8);
  std::
  _Hashtable<glslang::TIntermBranch_*,_glslang::TIntermBranch_*,_std::allocator<glslang::TIntermBranch_*>,_std::__detail::_Identity,_std::equal_to<glslang::TIntermBranch_*>,_std::hash<glslang::TIntermBranch_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_110);
  return;
}

Assistant:

void PropagateNoContraction(const glslang::TIntermediate& intermediate)
{
    // First, traverses the AST, records symbols with their defining operations
    // and collects the initial set of precise symbols (symbol nodes that marked
    // as 'noContraction') and precise return nodes.
    auto mappings_and_precise_objects =
        getSymbolToDefinitionMappingAndPreciseSymbolIDs(intermediate);

    // The mapping of symbol node IDs to their defining nodes. This enables us
    // to get the defining node directly from a given symbol ID without
    // traversing the tree again.
    NodeMapping& symbol_definition_mapping = std::get<0>(mappings_and_precise_objects);

    // The mapping of object nodes to their access chains recorded.
    AccessChainMapping& accesschain_mapping = std::get<1>(mappings_and_precise_objects);

    // The initial set of 'precise' objects which are represented as the
    // access chain toward them.
    ObjectAccesschainSet& precise_object_accesschains = std::get<2>(mappings_and_precise_objects);

    // The set of 'precise' return nodes.
    ReturnBranchNodeSet& precise_return_nodes = std::get<3>(mappings_and_precise_objects);

    // Second, uses the initial set of precise objects as a work list, pops an
    // access chain, extract the symbol ID from it. Then:
    //  1) Check the assignee object, see if it is 'precise' object node or
    //  contains 'precise' object. Obtain the incremental access chain from the
    //  assignee node to its nested 'precise' node (if any).
    //  2) If the assignee object node is 'precise' or it contains 'precise'
    //  objects, traverses the right side of the assignment operation
    //  expression to mark arithmetic operations as 'noContration' and update
    //  'precise' access chain work list with new found object nodes.
    // Repeat above steps until the work list is empty.
    TNoContractionAssigneeCheckingTraverser checker(accesschain_mapping);
    TNoContractionPropagator propagator(&precise_object_accesschains, accesschain_mapping);

    // We have two initial precise work lists to handle:
    //  1) precise return nodes
    //  2) precise object access chains
    // We should process the precise return nodes first and the involved
    // objects in the return expression should be added to the precise object
    // access chain set.
    while (!precise_return_nodes.empty()) {
        glslang::TIntermBranch* precise_return_node = *precise_return_nodes.begin();
        propagator.propagateNoContractionInReturnNode(precise_return_node);
        precise_return_nodes.erase(precise_return_node);
    }

    while (!precise_object_accesschains.empty()) {
        // Get the access chain of a precise object from the work list.
        ObjectAccessChain precise_object_accesschain = *precise_object_accesschains.begin();
        // Get the symbol id from the access chain.
        ObjectAccessChain symbol_id = getFrontElement(precise_object_accesschain);
        // Get all the defining nodes of that symbol ID.
        std::pair<NodeMapping::iterator, NodeMapping::iterator> range =
            symbol_definition_mapping.equal_range(symbol_id);
        // Visits all the assignment nodes of that symbol ID and
        //  1) Check if the assignee node is 'precise' or contains 'precise'
        //  objects.
        //  2) Propagate the 'precise' to the top layer object nodes
        //  in the right side of the assignment operation, update the 'precise'
        //  work list with new access chains representing the new 'precise'
        //  objects, and mark arithmetic operations as 'noContraction'.
        for (NodeMapping::iterator defining_node_iter = range.first;
             defining_node_iter != range.second; defining_node_iter++) {
            TIntermOperator* defining_node = defining_node_iter->second;
            // Check the assignee node.
            auto checker_result = checker.getPrecisenessAndRemainedAccessChain(
                defining_node, precise_object_accesschain);
            bool& contain_precise = std::get<0>(checker_result);
            ObjectAccessChain& remained_accesschain = std::get<1>(checker_result);
            // If the assignee node is 'precise' or contains 'precise', propagate the
            // 'precise' to the right. Otherwise just skip this assignment node.
            if (contain_precise) {
                propagator.propagateNoContractionInOneExpression(defining_node,
                                                                 remained_accesschain);
            }
        }
        // Remove the last processed 'precise' object from the work list.
        precise_object_accesschains.erase(precise_object_accesschain);
    }
}